

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O3

int parse_instruction_token(Context_conflict *ctx,Token token)

{
  char *__src;
  Token TVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  Instruction_conflict *pIVar7;
  uint32 controls;
  char opstr [32];
  uint32 local_5c;
  undefined1 local_58 [40];
  
  TVar1 = token;
  if (token == 0x2b) {
    TVar1 = nexttoken(ctx);
  }
  if (TVar1 != TOKEN_IDENTIFIER) {
    failf(ctx,"%s","Expected instruction");
    return extraout_EAX;
  }
  local_5c = 0;
  __src = ctx->token;
  uVar4 = (uint)ctx->minor_ver;
  if (ctx->minor_ver == 0xff) {
    uVar4 = 0;
  }
  uVar3 = ctx->tokenlen;
  if (((uVar4 | (uint)ctx->major_ver << 0x10) < 0x10004) &&
     (iVar2 = check_token_segment(ctx,"TEX"), iVar2 != 0)) {
    local_5c = 0;
  }
  else {
    iVar2 = check_token_segment(ctx,"TEXLDP");
    if (iVar2 == 0) {
      iVar2 = check_token_segment(ctx,"TEXLDB");
      if (iVar2 == 0) {
        pIVar7 = instructions;
        uVar6 = 0;
        do {
          if ((pIVar7->opcode_string != (char *)0x0) &&
             (iVar2 = check_token_segment(ctx,pIVar7->opcode_string), iVar2 != 0)) {
            if ((ctx->tokenlen == 0) || (*ctx->token == '_')) {
              uVar4 = (uint)uVar6;
              if (uVar4 == 0x5e) {
                iVar2 = parse_condition(ctx,&local_5c);
                uVar6 = 0x5e;
                if (iVar2 == 0) {
                  failf(ctx,"%s","SETP requires a condition");
                }
                goto LAB_0012312e;
              }
              if (uVar4 == 0x2c) {
                iVar2 = parse_condition(ctx,&local_5c);
                iVar5 = 0x2d;
              }
              else {
                if (uVar4 != 0x28) {
                  if (uVar4 != 0x61) goto LAB_00123131;
                  break;
                }
                iVar2 = parse_condition(ctx,&local_5c);
                iVar5 = 0x29;
              }
              uVar6 = (ulong)(iVar5 - (uint)(iVar2 == 0));
              goto LAB_0012312e;
            }
            ctx->token = __src;
            ctx->tokenlen = uVar3;
          }
          uVar6 = uVar6 + 1;
          pIVar7 = pIVar7 + 1;
        } while (uVar6 != 0x61);
        goto LAB_00123217;
      }
      local_5c = 2;
    }
    else {
      local_5c = 1;
    }
  }
  uVar6 = 0x42;
LAB_0012312e:
  uVar4 = (uint)uVar6;
LAB_00123131:
  if ((ctx->tokenlen == 0) || (*ctx->token == '_')) {
    ctx->tokenbufpos = 0;
    iVar2 = (*instructions[uVar6].parse_args)(ctx);
    uVar3 = (iVar2 - 1U & 0xf) << 0x18;
    if (ctx->major_ver < 2) {
      uVar3 = 0;
    }
    output_token_noswap(ctx,(uint)(token == 0x2b) << 0x1e | uVar4 & 0xffff |
                            (local_5c & 0xff) << 0x10 | uVar3);
    if (iVar2 < 2) {
      return extraout_EAX_00;
    }
    uVar6 = 0;
    do {
      output_token_noswap(ctx,ctx->tokenbuf[uVar6]);
      uVar6 = uVar6 + 1;
    } while (iVar2 - 1U != uVar6);
    return extraout_EAX_01;
  }
LAB_00123217:
  uVar4 = 0x1f;
  if ((int)uVar3 < 0x1f) {
    uVar4 = uVar3;
  }
  memcpy(local_58,__src,(long)(int)uVar4);
  local_58[(int)uVar4] = 0;
  failf(ctx,"Unknown instruction \'%s\'",local_58);
  return extraout_EAX_02;
}

Assistant:

static int parse_instruction_token(Context *ctx, Token token)
{
    int coissue = 0;
    int predicated = 0;

    if (token == ((Token) '+'))
    {
        coissue = 1;
        token = nexttoken(ctx);
    } // if

    if (token != TOKEN_IDENTIFIER)
    {
        fail(ctx, "Expected instruction");
        return 0;
    } // if

    uint32 controls = 0;
    uint32 opcode = OPCODE_TEXLD;
    const char *origtoken = ctx->token;
    const unsigned int origtokenlen = ctx->tokenlen;

    // "TEX" is only meaningful in ps_1_1.
    if ((!shader_version_atleast(ctx, 1, 4)) && (check_token_segment(ctx, "TEX")))
        controls = 0;

    // This might need to be TEXLD instead of TEXLDP.
    else if (check_token_segment(ctx, "TEXLDP"))
        controls = CONTROL_TEXLDP;

    // This might need to be TEXLD instead of TEXLDB.
    else if (check_token_segment(ctx, "TEXLDB"))
        controls = CONTROL_TEXLDB;

    else  // find the instruction.
    {
        size_t i;
        for (i = 0; i < STATICARRAYLEN(instructions); i++)
        {
            const char *opcode_string = instructions[i].opcode_string;
            if (opcode_string == NULL)
                continue;  // skip this.
            else if (!check_token_segment(ctx, opcode_string))
                continue;  // not us.
            else if ((ctx->tokenlen > 0) && (*ctx->token != '_'))
            {
                ctx->token = origtoken;
                ctx->tokenlen = origtokenlen;
                continue;  // not the match: TEXLD when we wanted TEXLDL, etc.
            } // if

            break;  // found it!
        } // for

        opcode = (uint32) i;

        // This might need to be IFC instead of IF.
        if (opcode == OPCODE_IF)
        {
            if (parse_condition(ctx, &controls))
                opcode = OPCODE_IFC;
        } // if

        // This might need to be BREAKC instead of BREAK.
        else if (opcode == OPCODE_BREAK)
        {
            if (parse_condition(ctx, &controls))
                opcode = OPCODE_BREAKC;
        } // else if

        // SETP has a conditional code, always.
        else if (opcode == OPCODE_SETP)
        {
            if (!parse_condition(ctx, &controls))
                fail(ctx, "SETP requires a condition");
        } // else if
    } // else

    if ( (opcode == STATICARRAYLEN(instructions)) ||
         ((ctx->tokenlen > 0) && (ctx->token[0] != '_')) )
    {
        char opstr[32];
        const int len = Min(sizeof (opstr) - 1, origtokenlen);
        memcpy(opstr, origtoken, len);
        opstr[len] = '\0';
        failf(ctx, "Unknown instruction '%s'", opstr);
        return 0;
    } // if

    const Instruction *instruction = &instructions[opcode];

    // !!! FIXME: predicated instructions

    ctx->tokenbufpos = 0;

    const int tokcount = instruction->parse_args(ctx);

    // insttoks bits are reserved and should be zero if < SM2.
    const uint32 insttoks = shader_version_atleast(ctx, 2, 0) ? tokcount-1 : 0;

    // write out the instruction token.
    output_token(ctx, ((opcode & 0xFFFF) << 0) |
                      ((controls & 0xFF) << 16) |
                      ((insttoks & 0xF) << 24) |
                      ((coissue) ? 0x40000000 : 0x00000000) |
                      ((predicated) ? 0x10000000 : 0x00000000) );

    // write out the argument tokens.
    int i;
    for (i = 0; i < (tokcount-1); i++)
        output_token(ctx, ctx->tokenbuf[i]);

    return 1;
}